

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
          (connection<websocketpp::config::asio::transport_config> *this,
          vector<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
          *bufs,write_handler *handler)

{
  basic_stream_socket<asio::ip::tcp> *s;
  element_type *peVar1;
  pointer pbVar2;
  undefined1 local_138 [56];
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  local_100;
  code *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b8 [64];
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
  local_78;
  
  for (pbVar2 = (bufs->
                super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (bufs->
                super__Vector_base<websocketpp::transport::buffer,_std::allocator<websocketpp::transport::buffer>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    local_138._16_8_ = pbVar2->buf;
    local_138._24_8_ = pbVar2->len;
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
    emplace_back<asio::const_buffer>(&this->m_bufs,(const_buffer *)(local_138 + 0x10));
  }
  s = (this->super_socket_con_type).m_socket.
      super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr;
  peVar1 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_c8 = handle_async_write;
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_138);
  std::
  _Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>
  ::
  _Bind<std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>
              *)local_b8,
             (offset_in_connection<websocketpp::config::asio::transport_config>_to_subr *)&local_c8,
             (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
              *)local_138,handler,(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2);
  make_custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>
            (&local_78,(asio *)&this->m_write_handler_allocator,(handler_allocator *)local_b8,
             (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>
              *)handler);
  local_138._16_8_ = peVar1->service_;
  local_138._24_8_ = peVar1->impl_;
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
  ::custom_alloc_handler
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>
              *)(local_138 + 0x20),&local_78);
  ::asio::
  async_write<asio::basic_stream_socket<asio::ip::tcp>,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>
            (s,&this->m_bufs,
             (wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
              *)(local_138 + 0x10),(type *)0x0);
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl(&local_100);
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl(&local_78.handler_._M_bound_args.
                  super__Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                );
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  *)(local_b8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
  return;
}

Assistant:

void async_write(std::vector<buffer> const & bufs, write_handler handler) {
        std::vector<buffer>::const_iterator it;

        for (it = bufs.begin(); it != bufs.end(); ++it) {
            m_bufs.push_back(lib::asio::buffer((*it).buf,(*it).len));
        }

        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                m_strand->wrap(make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_socket(),
                m_bufs,
                make_custom_alloc_handler(
                    m_write_handler_allocator,
                    lib::bind(
                        &type::handle_async_write, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );
        }
    }